

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.c
# Opt level: O3

float calc_average_generic(pooling_calc_context_t calc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  undefined8 in_stack_00000030;
  code *in_stack_00000038;
  int in_stack_00000050;
  char in_stack_00000058;
  
  fVar7 = 0.0;
  if (in_stack_0000002c == 3) {
    if (in_stack_00000058 == '\0') {
      in_stack_00000028 =
           (in_stack_0000001c - in_stack_00000018) *
           (in_stack_00000014 - in_stack_00000010) * (in_stack_0000000c - in_stack_00000008);
    }
    if (in_stack_00000008 < in_stack_0000000c) {
      iVar2 = in_stack_00000010 * in_stack_00000024 +
              in_stack_00000020 * in_stack_00000008 + in_stack_00000050 + in_stack_00000018;
      do {
        iVar3 = iVar2;
        iVar5 = in_stack_00000010;
        if (in_stack_00000010 < in_stack_00000014) {
          do {
            iVar4 = in_stack_0000001c - in_stack_00000018;
            iVar1 = iVar3;
            if (in_stack_00000018 < in_stack_0000001c) {
              do {
                fVar6 = (float)(*in_stack_00000038)(in_stack_00000030,iVar1);
                fVar7 = fVar7 + fVar6;
                iVar1 = iVar1 + 1;
                iVar4 = iVar4 + -1;
              } while (iVar4 != 0);
            }
            iVar5 = iVar5 + 1;
            iVar3 = iVar3 + in_stack_00000024;
          } while (iVar5 != in_stack_00000014);
        }
        in_stack_00000008 = in_stack_00000008 + 1;
        iVar2 = iVar2 + in_stack_00000020;
      } while (in_stack_00000008 != in_stack_0000000c);
    }
  }
  else if (in_stack_0000002c == 2) {
    if (in_stack_00000058 == '\0') {
      in_stack_00000028 =
           (in_stack_00000014 - in_stack_00000010) * (in_stack_0000000c - in_stack_00000008);
    }
    if (in_stack_00000008 < in_stack_0000000c) {
      do {
        if (in_stack_00000010 < in_stack_00000014) {
          iVar2 = in_stack_00000020 * in_stack_00000008 + in_stack_00000010;
          do {
            fVar6 = (float)(*in_stack_00000038)(in_stack_00000030,in_stack_00000050 + iVar2);
            fVar7 = fVar7 + fVar6;
            iVar2 = iVar2 + 1;
          } while (iVar2 < in_stack_00000014 + in_stack_00000020 * in_stack_00000008);
        }
        in_stack_00000008 = in_stack_00000008 + 1;
      } while (in_stack_00000008 != in_stack_0000000c);
    }
  }
  return fVar7 / (float)in_stack_00000028;
}

Assistant:

float calc_average_generic(pooling_calc_context_t calc) {
  float val = 0.0f;
  float average_val = 0.0f;
  if (calc.kernel_size == 2) {
    if (!calc.including_pad) {
      calc.pool_size = (calc.hend - calc.hstart) * (calc.wend - calc.wstart);
    }
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = ix * calc.hstride + calc.wstart;
           jx < ix * calc.hstride + calc.wend; jx++) {
        val += calc.get_x(calc.x, jx + calc.offset_x);
      }
    }
  } else if (calc.kernel_size == 3) {
    if (!calc.including_pad) {
      calc.pool_size = (calc.hend - calc.hstart) * (calc.wend - calc.wstart) *
                       (calc.dend - calc.dstart);
    }
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = calc.wstart; jx < calc.wend; jx++) {
        for (int kx = calc.dstart; kx < calc.dend; kx++) {
          val += calc.get_x(calc.x, ix * calc.hstride + jx * calc.wstride + kx +
                                        calc.offset_x);
        }
      }
    }
  }
  average_val = val / calc.pool_size;
  return average_val;
}